

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O2

void __thiscall
vkt::compute::anon_unknown_0::InvertSSBOInPlaceTest::initPrograms
          (InvertSSBOInPlaceTest *this,SourceCollections *sourceCollections)

{
  ostream *poVar1;
  ProgramSources *this_00;
  ostringstream src;
  allocator<char> local_202;
  allocator<char> local_201;
  undefined1 local_200 [40];
  string local_1d8;
  string local_1b8;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"#version 310 es\n");
  poVar1 = std::operator<<(poVar1,"layout (local_size_x = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_localSize).m_data[0]);
  poVar1 = std::operator<<(poVar1,", local_size_y = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_localSize).m_data[1]);
  poVar1 = std::operator<<(poVar1,", local_size_z = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_localSize).m_data[2]);
  poVar1 = std::operator<<(poVar1,") in;\n");
  poVar1 = std::operator<<(poVar1,"layout(binding = 0) buffer InOut {\n");
  poVar1 = std::operator<<(poVar1,"    uint values[");
  if (this->m_sized == true) {
    de::toString<unsigned_int>((string *)local_200,&this->m_numValues);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_200,"",&local_201);
  }
  poVar1 = std::operator<<(poVar1,(string *)local_200);
  poVar1 = std::operator<<(poVar1,"];\n");
  poVar1 = std::operator<<(poVar1,"} sb_inout;\n");
  poVar1 = std::operator<<(poVar1,"void main (void) {\n");
  poVar1 = std::operator<<(poVar1,
                           "    uvec3 size           = gl_NumWorkGroups * gl_WorkGroupSize;\n");
  poVar1 = std::operator<<(poVar1,
                           "    uint numValuesPerInv = uint(sb_inout.values.length()) / (size.x*size.y*size.z);\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "    uint groupNdx        = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
                          );
  poVar1 = std::operator<<(poVar1,"    uint offset          = numValuesPerInv*groupNdx;\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"    for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n");
  poVar1 = std::operator<<(poVar1,
                           "        sb_inout.values[offset + ndx] = ~sb_inout.values[offset + ndx];\n"
                          );
  std::operator<<(poVar1,"}\n");
  std::__cxx11::string::~string((string *)local_200);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"comp",&local_202);
  this_00 = ::vk::ProgramCollection<glu::ProgramSources>::add
                      (&sourceCollections->glslSources,&local_1b8);
  std::__cxx11::stringbuf::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)local_200,&local_1d8);
  glu::ProgramSources::operator<<(this_00,(ShaderSource *)local_200);
  std::__cxx11::string::~string((string *)(local_200 + 8));
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void InvertSSBOInPlaceTest::initPrograms (SourceCollections& sourceCollections) const
{
	std::ostringstream src;
	src << "#version 310 es\n"
		<< "layout (local_size_x = " << m_localSize.x() << ", local_size_y = " << m_localSize.y() << ", local_size_z = " << m_localSize.z() << ") in;\n"
		<< "layout(binding = 0) buffer InOut {\n"
		<< "    uint values[" << (m_sized ? de::toString(m_numValues) : "") << "];\n"
		<< "} sb_inout;\n"
		<< "void main (void) {\n"
		<< "    uvec3 size           = gl_NumWorkGroups * gl_WorkGroupSize;\n"
		<< "    uint numValuesPerInv = uint(sb_inout.values.length()) / (size.x*size.y*size.z);\n"
		<< "    uint groupNdx        = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
		<< "    uint offset          = numValuesPerInv*groupNdx;\n"
		<< "\n"
		<< "    for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n"
		<< "        sb_inout.values[offset + ndx] = ~sb_inout.values[offset + ndx];\n"
		<< "}\n";

	sourceCollections.glslSources.add("comp") << glu::ComputeSource(src.str());
}